

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall
BailOutRecord::IsOffsetNativeIntOrFloat
          (BailOutRecord *this,uint offsetIndex,int argOutSlotStart,bool *pIsFloat64,bool *pIsInt32)

{
  code *pcVar1;
  BOOLEAN BVar2;
  BOOLEAN BVar3;
  bool bVar4;
  undefined4 *puVar5;
  bool isInt32;
  bool isFloat64;
  bool *pIsInt32_local;
  bool *pIsFloat64_local;
  int argOutSlotStart_local;
  uint offsetIndex_local;
  BailOutRecord *this_local;
  
  BVar2 = BVFixed::Test(this->argOutOffsetInfo->argOutFloat64Syms,argOutSlotStart + offsetIndex);
  BVar3 = BVFixed::Test(this->argOutOffsetInfo->argOutLosslessInt32Syms,
                        argOutSlotStart + offsetIndex);
  if ((BVar2 != '\0') && (BVar3 != '\0')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x34c,"(!isFloat64 || !isInt32)","!isFloat64 || !isInt32");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  *pIsFloat64 = BVar2 != '\0';
  *pIsInt32 = BVar3 != '\0';
  return;
}

Assistant:

void
BailOutRecord::IsOffsetNativeIntOrFloat(uint offsetIndex, int argOutSlotStart, bool * pIsFloat64, bool * pIsInt32) const
{
    bool isFloat64 = this->argOutOffsetInfo->argOutFloat64Syms->Test(argOutSlotStart + offsetIndex) != 0;
    bool isInt32 = this->argOutOffsetInfo->argOutLosslessInt32Syms->Test(argOutSlotStart + offsetIndex) != 0;
    Assert(!isFloat64 || !isInt32);

    *pIsFloat64 = isFloat64;
    *pIsInt32 = isInt32;
}